

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerHLSL::is_hlsl_force_storage_buffer_as_uav(CompilerHLSL *this,ID id)

{
  uint32_t uVar1;
  const_iterator cVar2;
  bool bVar3;
  key_type local_20;
  
  bVar3 = true;
  if ((this->hlsl_options).force_storage_buffer_as_uav == false) {
    uVar1 = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
    local_20.binding = Compiler::get_decoration((Compiler *)this,id,DecorationBinding);
    local_20.desc_set = uVar1;
    cVar2 = ::std::
            _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->force_uav_buffer_bindings)._M_h,&local_20);
    bVar3 = cVar2.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur !=
            (__node_type *)0x0;
  }
  return bVar3;
}

Assistant:

bool CompilerHLSL::is_hlsl_force_storage_buffer_as_uav(ID id) const
{
	if (hlsl_options.force_storage_buffer_as_uav)
	{
		return true;
	}

	const uint32_t desc_set = get_decoration(id, spv::DecorationDescriptorSet);
	const uint32_t binding = get_decoration(id, spv::DecorationBinding);

	return (force_uav_buffer_bindings.find({ desc_set, binding }) != force_uav_buffer_bindings.end());
}